

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O1

shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> __thiscall
CoreML::Recommender::constructAndValidateItemSimilarityRecommenderFromSpec
          (Recommender *this,Model *spec)

{
  long lVar1;
  void *pvVar2;
  element_type *peVar3;
  bool bVar4;
  LogMessage *other;
  invalid_argument *piVar5;
  string *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  long *plVar9;
  ModelDescription *pMVar10;
  shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> sVar11;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types;
  Result result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types_1;
  ItemSimilarityRecommender isr;
  allocator_type local_1a1;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  undefined1 local_190 [24];
  TypeCase *local_178;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [24];
  undefined1 local_138 [8];
  undefined4 local_130;
  undefined4 uStack_12c;
  TypeCase local_128 [2];
  undefined1 local_120 [8];
  long local_118 [4];
  CoreML *local_f8;
  Recommender *local_f0;
  element_type *local_e8;
  ModelDescription *local_e0;
  LogMessage local_d8;
  ItemSimilarityRecommender local_a0;
  
  pMVar10 = spec->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateModelDescription((Result *)&local_178,pMVar10,spec->specificationversion_);
  bVar4 = Result::good((Result *)&local_178);
  if (!bVar4) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
    std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
LAB_002bd5c1:
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (spec->_oneof_case_[0] != 0x1f5) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
    std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
    goto LAB_002bd5c1;
  }
  Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
            (&local_a0,(spec->Type_).itemsimilarityrecommender_);
  *(undefined8 *)this = 0;
  local_f0 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CoreML::Recommender::_ItemSimilarityRecommenderData,std::allocator<CoreML::Recommender::_ItemSimilarityRecommenderData>,CoreML::Specification::ItemSimilarityRecommender&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f0,
             (_ItemSimilarityRecommenderData **)this,
             (allocator<CoreML::Recommender::_ItemSimilarityRecommenderData> *)local_138,&local_a0);
  if (*(long *)(*(long *)this + 0xd0) == 0) {
    if ((pMVar10->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar5,"Name of column for item input data not specified.");
      goto LAB_002bd673;
    }
    if ((pMVar10->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_138,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    std::__cxx11::string::_M_assign((string *)(*(long *)this + 200));
  }
  local_138 = (undefined1  [8])0x700000006;
  local_130 = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)local_138;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_1a0,__l,(allocator_type *)local_150);
  local_f8 = (CoreML *)&pMVar10->input_;
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_138,local_f8,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(*(long *)this + 200),
             (string *)local_1a0,in_R8);
  local_178 = (TypeCase *)local_138;
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_130);
  if ((undefined1 *)CONCAT44(uStack_12c,local_130) != local_120) {
    operator_delete((undefined1 *)CONCAT44(uStack_12c,local_130),(long)local_120 + 1);
  }
  bVar4 = Result::good((Result *)&local_178);
  if (!bVar4) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
    std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_1a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a0,local_190._0_8_ - (long)local_1a0);
  }
  lVar8 = *(long *)this;
  if (*(long *)(lVar8 + 0x90) != 0) {
    local_150._0_4_ = kInt64Type;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_150;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_1a0,__l_00,&local_1a1);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_138,local_f8,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar8 + 0x88),
               (string *)local_1a0,in_R8);
    local_178 = (TypeCase *)local_138;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_130);
    if ((undefined1 *)CONCAT44(uStack_12c,local_130) != local_120) {
      operator_delete((undefined1 *)CONCAT44(uStack_12c,local_130),(long)local_120 + 1);
    }
    if (local_1a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a0,local_190._0_8_ - (long)local_1a0);
    }
    bVar4 = Result::good((Result *)&local_178);
    if (!bVar4) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
      std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
LAB_002bd673:
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_138._0_4_ = UNSUPPORTED_COMPATIBILITY_VERSION;
  local_138._4_4_ = MODEL_MAIN_IMAGE_OUTPUT_SIZE_BAD;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_138;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_150,__l_01,(allocator_type *)local_1a0);
  local_138 = (undefined1  [8])local_128;
  lVar8 = *(long *)(*(long *)this + 0xa8);
  local_e0 = pMVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_138,lVar8,*(long *)(*(long *)this + 0xb0) + lVar8);
  local_118[0] = (long)(local_118 + 2);
  lVar8 = *(long *)(*(long *)this + 0x68);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,lVar8,*(long *)(*(long *)this + 0x70) + lVar8);
  lVar8 = 0;
  local_e8 = (element_type *)this;
  do {
    if (*(long *)((long)&local_130 + lVar8) != 0) {
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_1a0,local_f8,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(local_138 + lVar8),
                 (string *)local_150,in_R8);
      local_178 = (TypeCase *)local_1a0;
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_198);
      if (local_198._M_p != local_190 + 8) {
        operator_delete(local_198._M_p,local_190._8_8_ + 1);
      }
      bVar4 = Result::good((Result *)&local_178);
      if (!bVar4) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
        std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    pMVar10 = local_e0;
    peVar3 = local_e8;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x40);
  lVar8 = -0x40;
  plVar9 = local_118 + 2;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  pvVar2 = (void *)CONCAT44(local_150._4_4_,local_150._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_150._16_8_ - (long)pvVar2);
  }
  lVar8 = *(long *)&(peVar3->item_interactions)._M_t._M_impl;
  lVar1 = *(long *)(lVar8 + 0x110);
  if (lVar1 != 0) {
    local_150._0_4_ = kDictionaryType;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_150;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_1a0,__l_02,&local_1a1);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_138,(CoreML *)&pMVar10->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar8 + 0x108),
               (string *)local_1a0,in_R8);
    local_178 = (TypeCase *)local_138;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_130);
    if ((undefined1 *)CONCAT44(uStack_12c,local_130) != local_120) {
      operator_delete((undefined1 *)CONCAT44(uStack_12c,local_130),(long)local_120 + 1);
    }
    if (local_1a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a0,local_190._0_8_ - (long)local_1a0);
    }
    bVar4 = Result::good((Result *)&local_178);
    if (!bVar4) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
      std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
      goto LAB_002bd6a5;
    }
  }
  lVar8 = *(long *)&(peVar3->item_interactions)._M_t._M_impl;
  if (*(long *)(lVar8 + 0xf0) == 0) {
    if (lVar1 != 0) goto LAB_002bd501;
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"No output columns specified.");
  }
  else {
    local_150._0_4_ = kSequenceType;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)local_150;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_1a0,__l_03,&local_1a1);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_138,(CoreML *)&pMVar10->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar8 + 0xe8),
               (string *)local_1a0,in_R8);
    local_178 = (TypeCase *)local_138;
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_130);
    if ((undefined1 *)CONCAT44(uStack_12c,local_130) != local_120) {
      operator_delete((undefined1 *)CONCAT44(uStack_12c,local_130),(long)local_120 + 1);
    }
    if (local_1a0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a0,local_190._0_8_ - (long)local_1a0);
    }
    bVar4 = Result::good((Result *)&local_178);
    if (bVar4) {
LAB_002bd501:
      Specification::ItemSimilarityRecommender::~ItemSimilarityRecommender(&local_a0);
      _Var7._M_pi = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
        _Var7._M_pi = extraout_RDX_00;
      }
      sVar11.
      super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var7._M_pi;
      sVar11.
      super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar3;
      return (shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData>)
             sVar11.
             super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar6 = Result::message_abi_cxx11_((Result *)&local_178);
    std::invalid_argument::invalid_argument(piVar5,(string *)psVar6);
  }
LAB_002bd6a5:
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<_ItemSimilarityRecommenderData>
  constructAndValidateItemSimilarityRecommenderFromSpec(const Specification::Model& spec){
    const auto& interface = spec.description();

      // Validate its a MLModel type.
    auto result = validateModelDescription(interface, spec.specificationversion());

    if(!result.good()) {
      throw std::invalid_argument(result.message());
    }

    /** Preliminary. -- get the right tree parameters out to get all the nodes.
     */
    if(!spec.has_itemsimilarityrecommender()) {
      throw std::invalid_argument(result.message());
    }

    auto isr = spec.itemsimilarityrecommender();

    auto ret = std::make_shared<_ItemSimilarityRecommenderData>(isr);

    // Perform validation on the constructed data set

    // Validate the input column
    {
      if(ret->item_data_input_column.empty()) {
        if(interface.input_size() == 1) {
          ret->item_data_input_column = interface.input(0).name();
        } else {
          throw std::invalid_argument("Name of column for item input data not specified.");
        }
      }

      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kDictionaryType,
        Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                 ret->item_data_input_column,
                                                                 allowed_item_input_types);
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
    }

    // Now validate the num recommendations input
    {

      if(!ret->num_recommendations_input_column.empty()) {
        result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                   ret->num_recommendations_input_column,
                                                                   {Specification::FeatureType::kInt64Type});
        if(!result.good()) {
          throw std::invalid_argument(result.message());
        }
      }
    }

    // Now test the more advanced item inclusion and exclusion columns.
    {
      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      for(const auto& n : {ret->item_exclusion_input_column, ret->item_restriction_input_column}) {
        if(!n.empty()) {
          result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                     n,
                                                                     allowed_item_input_types);

          if(!result.good()) {
            throw std::invalid_argument(result.message());
          }
        }
      }
    }

    // Now validate the num recommendations output
    bool output_column_specified = false;
    if(!ret->item_score_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_score_output_column,
                                                                 {Specification::FeatureType::kDictionaryType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    // Now validate the num recommendations output
    if(!ret->item_list_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_list_output_column,
                                                                 {Specification::FeatureType::kSequenceType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    if(!output_column_specified) {
      throw std::invalid_argument("No output columns specified.");
    }

    return ret;
  }